

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

int64_t sensors_analytics::utils::GenerateTrackId(void)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  uint __uval;
  uint __val;
  uint uVar11;
  ulong __val_00;
  string timestamp;
  string second;
  string timestamp_sub;
  string first;
  string second_sub;
  string first_sub;
  long *local_138;
  long local_128;
  long lStack_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  char *local_f8 [2];
  char local_e8 [16];
  timeval local_d8;
  undefined1 local_c8 [16];
  char *local_b8 [2];
  char local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  
  iVar2 = rand();
  __val = iVar2 % 99 + 100;
  uVar9 = 1;
  uVar11 = ((uint)(iVar2 % 99) < 0xffffff9c) + 2;
  if (__val < 10) {
    uVar11 = 1;
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct((ulong)local_b8,(char)uVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b8[0],uVar11,__val);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)local_b8);
  iVar2 = rand();
  uVar11 = iVar2 % 999 + 1000;
  if ((9 < uVar11) && (uVar9 = 2, 99 < uVar11)) {
    uVar9 = ((uint)(iVar2 % 999) < 0xfffffc18) + 3;
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct((ulong)local_f8,(char)uVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_f8[0],uVar9,uVar11);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_f8);
  gettimeofday(&local_d8,(__timezone_ptr_t)0x0);
  uVar10 = local_d8.tv_usec / 1000 + local_d8.tv_sec * 1000;
  __val_00 = -uVar10;
  if (0 < (long)uVar10) {
    __val_00 = uVar10;
  }
  uVar11 = 1;
  if (9 < __val_00) {
    uVar7 = __val_00;
    uVar9 = 4;
    do {
      uVar11 = uVar9;
      if (uVar7 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0010e873;
      }
      if (uVar7 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0010e873;
      }
      if (uVar7 < 10000) goto LAB_0010e873;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      uVar9 = uVar11 + 4;
    } while (bVar1);
    uVar11 = uVar11 + 1;
  }
LAB_0010e873:
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct((ulong)local_118,(char)uVar11 - (char)((long)uVar10 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_118[0] + -((long)uVar10 >> 0x3f),uVar11,__val_00);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_118);
  std::operator+(&local_98,&local_58,&local_78);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_98,local_d8.tv_sec);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_128 = *plVar8;
    lStack_120 = plVar3[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar8;
    local_138 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)local_138,(char **)&local_38,10);
  if (local_38 == local_138) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar5 == lVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 == 0) {
      *piVar4 = iVar2;
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((undefined1 *)local_d8.tv_sec != local_c8) {
      operator_delete((void *)local_d8.tv_sec);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    return lVar5;
  }
  uVar6 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((undefined1 *)local_d8.tv_sec != local_c8) {
    operator_delete((void *)local_d8.tv_sec);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int64_t GenerateTrackId() {
    string first = std::to_string(rand() % 99 + 100);
    string first_sub = first.substr(first.length() - 2, 2);

    string second = std::to_string(rand() % 999 + 1000);
    string second_sub = second.substr(second.length() - 3, 3);

    string timestamp = std::to_string(CurrentTimestamp());
    string timestamp_sub = timestamp.substr(timestamp.length() - 4, 4);

    return std::stoi(first_sub + second_sub + timestamp_sub);
}